

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O3

void testing_error_(testing t,int test_status,char *file,int line,char *msg)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *__format;
  char *pcVar4;
  
  sVar1 = strlen(msg);
  if ((int)sVar1 == 0) {
    pcVar2 = "\n";
  }
  else {
    pcVar2 = "\n";
    if (msg[(int)sVar1 + -1] == '\n') {
      pcVar2 = "";
    }
  }
  if (t->test_status < test_status) {
    t->test_status = test_status;
  }
  if ((t->partial_line).super___atomic_base<unsigned_int>._M_i == 0) {
    __format = "%s: %s:%d: %s%s";
  }
  else {
    (t->partial_line).super___atomic_base<unsigned_int>._M_i = 0;
    __format = "\n%s: %s:%d: %s%s";
  }
  pcVar4 = "info";
  if (test_status == 1) {
    pcVar4 = "error";
  }
  pcVar3 = "fatal";
  if (test_status != 2) {
    pcVar3 = pcVar4;
  }
  fprintf((FILE *)t->fp,__format,pcVar3,file,(ulong)(uint)line,msg,pcVar2);
  free(msg);
  return;
}

Assistant:

void testing_error_ (testing t, int test_status, const char *file, int line, char *msg) {
	int len = strlen (msg);
	int addnl = (len == 0 || msg[len - 1] != '\n');
	if (t->test_status < test_status) {
		t->test_status = test_status;
	}
	if (ATM_LOAD (&t->partial_line)) {
		ATM_STORE (&t->partial_line, 0);
		fprintf (t->fp, "\n%s: %s:%d: %s%s",
		         test_status == 2? "fatal": test_status == 1? "error": "info", file, line, msg,
		         addnl? "\n": "");
	} else {
		fprintf (t->fp, "%s: %s:%d: %s%s",
		         test_status == 2? "fatal": test_status == 1? "error": "info", file, line, msg,
		         addnl? "\n": "");
	}
	free (msg);
}